

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

pair<EigenAnswer,_double> * task2(pair<EigenAnswer,_double> *__return_storage_ptr__,Matrix *A)

{
  long lVar1;
  long lVar2;
  EigenAnswer ans;
  long local_48;
  EigenAnswer local_40;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  PowerIterationMethod(&local_40,A,&it);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_48 = (lVar2 - lVar1) / 1000000;
  std::pair<EigenAnswer,_double>::pair<EigenAnswer_&,_long,_true>
            (__return_storage_ptr__,&local_40,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<EigenAnswer, double> task2(const Matrix &A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = PowerIterationMethod(A);
    end = std::chrono::high_resolution_clock::now();

    return {ans, std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count()};
}